

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void pack_grammar(void)

{
  char cVar1;
  Yshort local_18;
  int prec;
  int assoc;
  int j;
  int i;
  
  ritem = (Yshort *)allocate(nitems << 2);
  if (ritem == (Yshort *)0x0) {
    no_space();
  }
  rlhs = (Yshort *)allocate(nrules << 2);
  if (rlhs == (Yshort *)0x0) {
    no_space();
  }
  rrhs = (Yshort *)allocate((nrules + 1) * 4);
  if (rrhs == (Yshort *)0x0) {
    no_space();
  }
  rprec = (Yshort *)realloc(rprec,((long)nrules & 0x3fffffffU) << 2);
  if (rprec == (Yshort *)0x0) {
    no_space();
  }
  rassoc = (char *)realloc(rassoc,(ulong)(uint)nrules);
  if (rassoc == (char *)0x0) {
    no_space();
  }
  *ritem = -1;
  ritem[1] = goal->index;
  ritem[2] = 0;
  ritem[3] = -2;
  *rlhs = 0;
  rlhs[1] = 0;
  rlhs[2] = start_symbol;
  *rrhs = 0;
  rrhs[1] = 0;
  rrhs[2] = 1;
  prec = 4;
  for (assoc = 3; assoc < nrules; assoc = assoc + 1) {
    if (0 < plhs[assoc]->args) {
      if (plhs[assoc]->argnames != (char **)0x0) {
        free(plhs[assoc]->argnames);
        plhs[assoc]->argnames = (char **)0x0;
      }
      if (plhs[assoc]->argtags != (char **)0x0) {
        free(plhs[assoc]->argtags);
        plhs[assoc]->argtags = (char **)0x0;
      }
    }
    rlhs[assoc] = plhs[assoc]->index;
    rrhs[assoc] = prec;
    cVar1 = '\0';
    local_18 = 0;
    for (; pitem[prec] != (bucket *)0x0; prec = prec + 1) {
      ritem[prec] = pitem[prec]->index;
      if (pitem[prec]->class == '\x01') {
        local_18 = pitem[prec]->prec;
        cVar1 = pitem[prec]->assoc;
      }
    }
    ritem[prec] = -assoc;
    prec = prec + 1;
    if (rprec[assoc] == -1) {
      rprec[assoc] = local_18;
      rassoc[assoc] = cVar1;
    }
  }
  rrhs[assoc] = prec;
  free(plhs);
  free(pitem);
  clean_arg_cache();
  return;
}

Assistant:

void pack_grammar()
{
    register int i, j;
    int assoc, prec;

    ritem = NEW2(nitems, Yshort);
    if (ritem == 0) no_space();
    rlhs = NEW2(nrules, Yshort);
    if (rlhs == 0) no_space();
    rrhs = NEW2(nrules+1, Yshort);
    if (rrhs == 0) no_space();
    rprec = RENEW(rprec, nrules, Yshort);
    if (rprec == 0) no_space();
    rassoc = RENEW(rassoc, nrules, char);
    if (rassoc == 0) no_space();

    ritem[0] = -1;
    ritem[1] = goal->index;
    ritem[2] = 0;
    ritem[3] = -2;
    rlhs[0] = 0;
    rlhs[1] = 0;
    rlhs[2] = start_symbol;
    rrhs[0] = 0;
    rrhs[1] = 0;
    rrhs[2] = 1;

    j = 4;
    for (i = 3; i < nrules; ++i) {
	if (plhs[i]->args > 0) {
	  if (plhs[i]->argnames) {
	    FREE(plhs[i]->argnames);
	    plhs[i]->argnames = 0;
	  }
	  if (plhs[i]->argtags) {
	    FREE(plhs[i]->argtags);
	    plhs[i]->argtags = 0;
	  }
	}
	rlhs[i] = plhs[i]->index;
	rrhs[i] = j;
	assoc = TOKEN;
	prec = 0;
	while (pitem[j]) {
	    ritem[j] = pitem[j]->index;
	    if (pitem[j]->class == TERM) {
		prec = pitem[j]->prec;
		assoc = pitem[j]->assoc; }
	    ++j; }
	ritem[j] = -i;
	++j;
	if (rprec[i] == UNDEFINED) {
	    rprec[i] = prec;
	    rassoc[i] = assoc; } }
    rrhs[i] = j;
    FREE(plhs);
    FREE(pitem);
    clean_arg_cache();
}